

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log::update_individual_log(Log *this)

{
  long lVar1;
  pointer pbVar2;
  pointer ppGVar3;
  pointer pbVar4;
  ulong uVar5;
  ulong uVar6;
  string s;
  string graph_string;
  string log;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator+(&local_d0,"Label:\t\t",&this->label);
  std::operator+(&local_110,&local_d0,"\nTotal:\t\t");
  std::__cxx11::to_string(&local_50,this->total);
  std::operator+(&local_f0,&local_110,&local_50);
  std::operator+(&local_150,&local_f0,"\nAverage:\t");
  std::__cxx11::to_string(&local_70,this->average);
  std::operator+(&local_b0,&local_150,&local_70);
  std::operator+(&local_190,&local_b0," seconds\nLast:\t\t");
  std::__cxx11::to_string(&local_90,this->last);
  std::operator+(&local_170,&local_190,&local_90);
  std::operator+(&local_130,&local_170," seconds");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&local_130);
  ppGVar3 = (this->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(this->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3);
      uVar6 = uVar6 + 1) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator+(&local_190,
                   &(this->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6]->label,":\t");
    std::__cxx11::string::append((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    uVar5 = 0;
    while( true ) {
      ppGVar3 = (this->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar1 = *(long *)&(ppGVar3[uVar6]->points).
                        super__Vector_base<Point_*,_std::allocator<Point_*>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&(ppGVar3[uVar6]->points).
                                 super__Vector_base<Point_*,_std::allocator<Point_*>_>._M_impl + 8)
                  - lVar1 >> 3) <= uVar5) break;
      std::__cxx11::to_string(&local_110,**(double **)(lVar1 + uVar5 * 8));
      std::operator+(&local_f0,"(",&local_110);
      std::operator+(&local_150,&local_f0,",");
      std::__cxx11::to_string
                (&local_d0,
                 *(int *)(*(long *)(*(long *)&((this->graphs).
                                               super__Vector_base<Graph_*,_std::allocator<Graph_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar6]->
                                              points).
                                              super__Vector_base<Point_*,_std::allocator<Point_*>_>.
                                              _M_impl.super__Vector_impl_data + uVar5 * 8) + 8));
      std::operator+(&local_b0,&local_150,&local_d0);
      std::operator+(&local_190,&local_b0,"),");
      std::__cxx11::string::append((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      uVar5 = uVar5 + 1;
    }
  }
  std::__cxx11::string::append((char *)&local_130);
  pbVar2 = (this->rawText).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->rawText).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)&local_190,(string *)pbVar4);
    std::__cxx11::string::append((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::operator+(&local_190,&local_130,&local_170);
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&records_abi_cxx11_,&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  return;
}

Assistant:

void Log::update_individual_log() {
    std::string log =
            "Label:\t\t" + label + "\nTotal:\t\t" + std::to_string(total) + "\nAverage:\t" + std::to_string(average) +
            " seconds\nLast:\t\t"
            + std::to_string(last) + " seconds";
    std::string graph_string;
    log += "\nGraphs:\t";
    for (int i = 0; i < graphs.size(); i++) {
        std::cout << "\n";
        graph_string += graphs[i]->label + ":\t";
        for (int j = 0; j < graphs[i]->points.size(); j++) {
            graph_string +=
                    "(" + std::to_string(graphs[i]->points[j]->x) + "," + std::to_string(graphs[i]->points[j]->y) + "),";
        }


    }

    log+= "\nRaw Text\n";
    for(std::string s : rawText)
    {
        log+= s;
    }
    log = log + graph_string;

    Log::records.push_back(log);
}